

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vx-sound.c
# Opt level: O2

void ALCheckForErrors(void)

{
  int iVar1;
  char *__ptr;
  size_t sStack_20;
  
  iVar1 = alGetError();
  if (iVar1 != 0) {
    fwrite("An error occurred!\n",0x13,1,_stderr);
    switch(iVar1) {
    case 0xa001:
      __ptr = "ALC_INVALID_DEVICE: a bad device was passed to an OpenAL function";
      sStack_20 = 0x41;
      break;
    case 0xa002:
      __ptr = "ALC_INVALID_CONTEXT: a bad context was passed to an OpenAL function";
      sStack_20 = 0x43;
      break;
    case 0xa003:
      __ptr = "ALC_INVALID_ENUM: an unknown enum value was passed to an OpenAL function";
      sStack_20 = 0x48;
      break;
    case 0xa004:
      __ptr = "ALC_INVALID_VALUE: an invalid value was passed to an OpenAL function";
      sStack_20 = 0x44;
      break;
    case 0xa005:
      __ptr = "ALC_OUT_OF_MEMORY: an unknown enum value was passed to an OpenAL function";
      sStack_20 = 0x49;
      break;
    default:
      __ptr = "UNKNOWN ALC ERROR";
      sStack_20 = 0x11;
    }
    fwrite(__ptr,sStack_20,1,_stderr);
    fputc(10,_stderr);
    return;
  }
  return;
}

Assistant:

void ALCheckForErrors() {
    ALCenum error = alGetError();
    if (error != ALC_NO_ERROR) {
        fprintf(stderr, "An error occurred!\n");
        switch (error) {
            case ALC_INVALID_VALUE:
                fprintf(stderr, "ALC_INVALID_VALUE: an invalid value was passed to an OpenAL function");
                break;
            case ALC_INVALID_DEVICE:
                fprintf(stderr, "ALC_INVALID_DEVICE: a bad device was passed to an OpenAL function");
                break;
            case ALC_INVALID_CONTEXT:
                fprintf(stderr, "ALC_INVALID_CONTEXT: a bad context was passed to an OpenAL function");
                break;
            case ALC_INVALID_ENUM:
                fprintf(stderr, "ALC_INVALID_ENUM: an unknown enum value was passed to an OpenAL function");
                break;
            case ALC_OUT_OF_MEMORY:
                fprintf(stderr, "ALC_OUT_OF_MEMORY: an unknown enum value was passed to an OpenAL function");
                break;
            default:
                fprintf(stderr, "UNKNOWN ALC ERROR");
        }
        fprintf(stderr, "\n");
    }
}